

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O3

void __thiscall ConfigReader::error(ConfigReader *this,string *errstr)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Line ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(errstr->_M_dataplus)._M_p,errstr->_M_string_length);
  std::__cxx11::stringbuf::str();
  doLog(8,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void ConfigReader::error(const std::string &errstr)
{
    std::stringstream ss;
    ss << "Line " << m_lineNum << " : " << errstr; 
    doLog(LOG_ERROR, ss.str());
}